

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase85::run(TestCase85 *this)

{
  StructDataBitCount *this_00;
  Builder reader;
  Reader reader_00;
  Reader reader_01;
  initializer_list<unsigned_int> expected;
  initializer_list<unsigned_int> expected_00;
  initializer_list<unsigned_int> expected_01;
  initializer_list<unsigned_int> init;
  bool bVar1;
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *value;
  uint local_2e4 [3];
  iterator local_2d8;
  undefined8 local_2d0;
  Reader local_2c8;
  Reader local_298;
  bool local_264;
  bool local_263;
  DebugExpression<bool> local_262;
  bool local_261;
  bool _kj_shouldLog_4;
  DebugExpression<bool> _kjCondition_4;
  void *pvStack_260;
  bool _kj_shouldLog_3;
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *local_258;
  undefined1 local_250 [8];
  DebugComparison<capnp::Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>_&,_std::nullptr_t>
  _kjCondition_3;
  bool _kj_shouldLog_2;
  DebugExpression<bool> _kjCondition_2;
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> local_208;
  uint local_1dc [3];
  iterator local_1d0;
  undefined8 local_1c8;
  ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> local_1c0;
  bool local_18b;
  bool local_18a;
  DebugExpression<bool> local_189;
  undefined1 local_188 [5];
  bool _kj_shouldLog_1;
  DebugExpression<bool> _kjCondition_1;
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> orphan;
  bool _kj_shouldLog;
  DebugExpression<bool> _kjCondition;
  ArrayPtr<const_unsigned_int> local_148 [2];
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase85 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  orphan.builder.location._4_4_ = 0xc;
  init._M_len = 3;
  init._M_array = (iterator)((long)&orphan.builder.location + 4);
  kj::ArrayPtr<const_unsigned_int>::ArrayPtr(local_148,init);
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt32List
            ((Builder *)local_128,local_148[0]);
  orphan.builder.location._2_1_ =
       capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt32List((Builder *)local_128);
  orphan.builder.location._3_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                  (bool *)((long)&orphan.builder.location + 2));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)((long)&orphan.builder.location + 3));
  if (!bVar1) {
    orphan.builder.location._1_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)orphan.builder.location._1_1_ != false) {
      kj::_::Debug::log<char_const(&)[38],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x5a,ERROR,"\"failed: expected \" \"root.hasUInt32List()\", _kjCondition",
                 (char (*) [38])"failed: expected root.hasUInt32List()",
                 (DebugExpression<bool> *)((long)&orphan.builder.location + 3));
      orphan.builder.location._1_1_ = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::disownUInt32List
            ((Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_188,(Builder *)local_128);
  bVar1 = Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::operator==
                    ((Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_188,(void *)0x0);
  local_18a = (bool)(~bVar1 & 1);
  local_189 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_18a);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_189);
  if (!bVar1) {
    local_18b = kj::_::Debug::shouldLog(ERROR);
    while (local_18b != false) {
      kj::_::Debug::log<char_const(&)[38],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x5d,ERROR,"\"failed: expected \" \"!(orphan == nullptr)\", _kjCondition",
                 (char (*) [38])"failed: expected !(orphan == nullptr)",&local_189);
      local_18b = false;
    }
  }
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::getReader
            (&local_1c0,(Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_188);
  local_1dc[0] = 0xc;
  local_1dc[1] = 0x22;
  local_1dc[2] = 0x38;
  local_1d0 = local_1dc;
  local_1c8 = 3;
  expected_01._M_len = 3;
  expected_01._M_array = local_1d0;
  reader_00.reader.capTable = local_1c0.reader.capTable;
  reader_00.reader.segment = local_1c0.reader.segment;
  reader_00.reader.ptr = local_1c0.reader.ptr;
  reader_00.reader.elementCount = local_1c0.reader.elementCount;
  reader_00.reader.step = local_1c0.reader.step;
  reader_00.reader.structDataSize = local_1c0.reader.structDataSize;
  reader_00.reader.structPointerCount = local_1c0.reader.structPointerCount;
  reader_00.reader.elementSize = local_1c0.reader.elementSize;
  reader_00.reader._39_1_ = local_1c0.reader._39_1_;
  reader_00.reader.nestingLimit = local_1c0.reader.nestingLimit;
  reader_00.reader._44_4_ = local_1c0.reader._44_4_;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_int,_(capnp::Kind)0>_>
            (reader_00,expected_01);
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::get
            (&local_208,(Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_188);
  _kjCondition_3._36_4_ = 0xc;
  expected_00._M_len = 3;
  expected_00._M_array = (iterator)&_kjCondition_3.field_0x24;
  reader.builder.capTable = local_208.builder.capTable;
  reader.builder.segment = local_208.builder.segment;
  reader.builder.ptr = local_208.builder.ptr;
  reader.builder.elementCount = local_208.builder.elementCount;
  reader.builder.step = local_208.builder.step;
  reader.builder.structDataSize = local_208.builder.structDataSize;
  reader.builder.structPointerCount = local_208.builder.structPointerCount;
  reader.builder.elementSize = local_208.builder.elementSize;
  reader.builder._39_1_ = local_208.builder._39_1_;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_int,_(capnp::Kind)0>,_false>
            (reader,expected_00);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt32List((Builder *)local_128);
  _kjCondition_3._34_1_ = ~bVar1 & 1;
  _kjCondition_3._35_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_3.field_0x22);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)&_kjCondition_3.field_0x23);
  if (!bVar1) {
    _kjCondition_3._33_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_3._33_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[41],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x61,ERROR,"\"failed: expected \" \"!(root.hasUInt32List())\", _kjCondition",
                 (char (*) [41])"failed: expected !(root.hasUInt32List())",
                 (DebugExpression<bool> *)&_kjCondition_3.field_0x23);
      _kjCondition_3._33_1_ = 0;
    }
  }
  value = kj::mv<capnp::Orphan<capnp::List<unsigned_int,(capnp::Kind)0>>>
                    ((Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_188);
  capnproto_test::capnp::test::TestAllTypes::Builder::adoptUInt32List((Builder *)local_128,value);
  local_258 = (Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_188);
  pvStack_260 = (void *)0x0;
  kj::_::DebugExpression<capnp::Orphan<capnp::List<unsigned_int,(capnp::Kind)0>>&>::operator==
            ((DebugComparison<capnp::Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>_&,_std::nullptr_t>
              *)local_250,
             (DebugExpression<capnp::Orphan<capnp::List<unsigned_int,(capnp::Kind)0>>&> *)&local_258
             ,&stack0xfffffffffffffda0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_250);
  if (!bVar1) {
    local_261 = kj::_::Debug::shouldLog(ERROR);
    while (local_261 != false) {
      kj::_::Debug::
      log<char_const(&)[35],kj::_::DebugComparison<capnp::Orphan<capnp::List<unsigned_int,(capnp::Kind)0>>&,decltype(nullptr)>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,100,ERROR,"\"failed: expected \" \"orphan == nullptr\", _kjCondition",
                 (char (*) [35])"failed: expected orphan == nullptr",
                 (DebugComparison<capnp::Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>_&,_std::nullptr_t>
                  *)local_250);
      local_261 = false;
    }
  }
  local_263 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt32List
                        ((Builder *)local_128);
  local_262 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_263);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_262);
  if (!bVar1) {
    local_264 = kj::_::Debug::shouldLog(ERROR);
    while (local_264 != false) {
      kj::_::Debug::log<char_const(&)[38],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x65,ERROR,"\"failed: expected \" \"root.hasUInt32List()\", _kjCondition",
                 (char (*) [38])"failed: expected root.hasUInt32List()",&local_262);
      local_264 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader(&local_2c8,(Builder *)local_128);
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt32List(&local_298,&local_2c8);
  local_2e4[0] = 0xc;
  local_2e4[1] = 0x22;
  local_2e4[2] = 0x38;
  local_2d8 = local_2e4;
  local_2d0 = 3;
  expected._M_len = 3;
  expected._M_array = local_2d8;
  reader_01.reader.capTable = local_298.reader.capTable;
  reader_01.reader.segment = local_298.reader.segment;
  reader_01.reader.ptr = local_298.reader.ptr;
  reader_01.reader.elementCount = local_298.reader.elementCount;
  reader_01.reader.step = local_298.reader.step;
  reader_01.reader.structDataSize = local_298.reader.structDataSize;
  reader_01.reader.structPointerCount = local_298.reader.structPointerCount;
  reader_01.reader.elementSize = local_298.reader.elementSize;
  reader_01.reader._39_1_ = local_298.reader._39_1_;
  reader_01.reader.nestingLimit = local_298.reader.nestingLimit;
  reader_01.reader._44_4_ = local_298.reader._44_4_;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_int,_(capnp::Kind)0>_>
            (reader_01,expected);
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::~Orphan
            ((Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_188);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Orphans, Lists) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  root.setUInt32List({12, 34, 56});
  EXPECT_TRUE(root.hasUInt32List());

  Orphan<List<uint32_t>> orphan = root.disownUInt32List();
  EXPECT_FALSE(orphan == nullptr);

  checkList(orphan.getReader(), {12u, 34u, 56u});
  checkList(orphan.get(), {12u, 34u, 56u});
  EXPECT_FALSE(root.hasUInt32List());

  root.adoptUInt32List(kj::mv(orphan));
  EXPECT_TRUE(orphan == nullptr);
  EXPECT_TRUE(root.hasUInt32List());
  checkList(root.asReader().getUInt32List(), {12u, 34u, 56u});
}